

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_on_stream_window_update_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  int iVar2;
  nghttp2_stream *stream_00;
  nghttp2_stream *stream;
  int rv;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  iVar1 = session_detect_idle_stream(session,(frame->hd).stream_id);
  if (iVar1 == 0) {
    stream_00 = nghttp2_session_get_stream(session,(frame->hd).stream_id);
    if (stream_00 == (nghttp2_stream *)0x0) {
      session_local._4_4_ = 0;
    }
    else {
      iVar1 = state_reserved_remote(session,stream_00);
      if (iVar1 == 0) {
        if ((frame->priority).pri_spec.stream_id == 0) {
          session_local._4_4_ =
               session_handle_invalid_connection
                         (session,frame,-0x1f9,"WINDOW_UPDATE: window_size_increment == 0");
        }
        else if (0x7fffffff - (frame->priority).pri_spec.stream_id < stream_00->remote_window_size)
        {
          session_local._4_4_ = session_handle_invalid_stream(session,frame,-0x20c);
        }
        else {
          stream_00->remote_window_size =
               (frame->priority).pri_spec.stream_id + stream_00->remote_window_size;
          if ((0 < stream_00->remote_window_size) &&
             (iVar1 = nghttp2_stream_check_deferred_by_flow_control(stream_00), iVar1 != 0)) {
            iVar1 = session_resume_deferred_stream_item(session,stream_00,'\x04');
            iVar2 = nghttp2_is_fatal(iVar1);
            if (iVar2 != 0) {
              return iVar1;
            }
          }
          session_local._4_4_ = session_call_on_frame_received(session,frame);
        }
      }
      else {
        session_local._4_4_ =
             session_handle_invalid_connection
                       (session,frame,-0x1f9,"WINDOW_UPADATE to reserved stream");
      }
    }
  }
  else {
    session_local._4_4_ =
         session_handle_invalid_connection(session,frame,-0x1f9,"WINDOW_UPDATE to idle stream");
  }
  return session_local._4_4_;
}

Assistant:

static int session_on_stream_window_update_received(nghttp2_session *session,
                                                    nghttp2_frame *frame) {
  int rv;
  nghttp2_stream *stream;

  if (session_detect_idle_stream(session, frame->hd.stream_id)) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "WINDOW_UPDATE to idle stream");
  }

  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
  if (!stream) {
    return 0;
  }
  if (state_reserved_remote(session, stream)) {
    return session_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO, "WINDOW_UPADATE to reserved stream");
  }
  if (frame->window_update.window_size_increment == 0) {
    return session_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO,
        "WINDOW_UPDATE: window_size_increment == 0");
  }
  if (NGHTTP2_MAX_WINDOW_SIZE - frame->window_update.window_size_increment <
      stream->remote_window_size) {
    return session_handle_invalid_stream(session, frame,
                                         NGHTTP2_ERR_FLOW_CONTROL);
  }
  stream->remote_window_size += frame->window_update.window_size_increment;

  if (stream->remote_window_size > 0 &&
      nghttp2_stream_check_deferred_by_flow_control(stream)) {

    rv = session_resume_deferred_stream_item(
        session, stream, NGHTTP2_STREAM_FLAG_DEFERRED_FLOW_CONTROL);

    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
  }
  return session_call_on_frame_received(session, frame);
}